

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O0

void __thiscall CVmRun::get_say_func(CVmRun *this,vm_val_t *val)

{
  undefined8 *puVar1;
  vm_val_t *in_RSI;
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x28) == 0) {
    vm_val_t::set_nil(in_RSI);
  }
  else {
    puVar1 = *(undefined8 **)(in_RDI + 0x28);
    *(undefined8 *)in_RSI = *puVar1;
    in_RSI->val = *(anon_union_8_8_cb74652f_for_val *)(puVar1 + 1);
  }
  return;
}

Assistant:

void CVmRun::get_say_func(vm_val_t *val) const
{
    /* 
     *   if we ever allocated a global to hold the 'say' function, return its
     *   value; otherwise, there's no 'say' function, so the result is nil 
     */
    if (say_func_ != 0)
        *val = say_func_->val;
    else
        val->set_nil();
}